

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_remove_plugin(_func_void *plugin)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  fsnav_plugin *pfVar5;
  fsnav_plugin *pfVar6;
  long lVar7;
  fsnav_core *pfVar8;
  char cVar9;
  size_t __size;
  long lVar10;
  fsnav_struct *pfVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  
  pfVar8 = &fsnav->core;
  sVar13 = (fsnav->core).plugin_count;
  if (sVar13 == 0) {
    cVar9 = '\0';
    __size = 0;
  }
  else {
    lVar7 = 0;
    cVar9 = '\0';
    pfVar11 = fsnav;
    uVar14 = 0;
    do {
      pfVar6 = (pfVar11->core).plugins;
      uVar1 = uVar14 + 1;
      if (pfVar6[uVar14].func == plugin) {
        lVar10 = lVar7;
        uVar15 = uVar14;
        if (uVar1 < sVar13) {
          do {
            pfVar6 = pfVar8->plugins;
            *(undefined8 *)((long)&pfVar6->tick + lVar10) =
                 *(undefined8 *)((long)&pfVar6[1].tick + lVar10);
            puVar3 = (undefined8 *)((long)&pfVar6[1].func + lVar10);
            uVar4 = puVar3[1];
            puVar2 = (undefined8 *)((long)&pfVar6->func + lVar10);
            *puVar2 = *puVar3;
            puVar2[1] = uVar4;
            uVar15 = uVar14 + 1;
            uVar12 = uVar14 + 2;
            lVar10 = lVar10 + 0x18;
            uVar14 = uVar15;
          } while (uVar12 < (pfVar11->core).plugin_count);
          pfVar6 = pfVar8->plugins;
        }
        pfVar6[uVar15].func = (_func_void *)0x0;
        pfVar11 = fsnav;
        pfVar6 = (fsnav->core).plugins;
        pfVar5 = pfVar6 + uVar15;
        pfVar5->cycle = 0;
        pfVar5->shift = 0;
        pfVar6[uVar15].tick = 0;
        sVar13 = (pfVar11->core).plugin_count - 1;
        (pfVar11->core).plugin_count = sVar13;
        cVar9 = cVar9 + '\x01';
      }
      pfVar8 = &pfVar11->core;
      lVar7 = lVar7 + 0x18;
      uVar14 = uVar1;
    } while (uVar1 < sVar13);
    __size = sVar13 * 0x18;
  }
  pfVar6 = (fsnav_plugin *)realloc(pfVar8->plugins,__size);
  if ((pfVar6 == (fsnav_plugin *)0x0) && ((fsnav->core).plugin_count != 0)) {
    fsnav_free();
    cVar9 = '\0';
  }
  else {
    (fsnav->core).plugins = pfVar6;
  }
  return cVar9;
}

Assistant:

char fsnav_remove_plugin(void(*plugin)(void))
{
	size_t       i, j;
	char         flag = 0;
	fsnav_plugin* reallocated_pointer;

	for (i = 0; i < fsnav->core.plugin_count; i++) { // go through the execution list
		if (fsnav->core.plugins[i].func != plugin)   // if not the requested plugin, do nothing
			continue;
		// otherwise, remove the current plugin from the execution list
		for (j = i+1; j < fsnav->core.plugin_count; j++) // copy all succeeding plugins one position lower
			fsnav->core.plugins[j-1] = fsnav->core.plugins[j];
		// reset the last one
		j--;
		fsnav->core.plugins[j].func  = NULL;
		fsnav->core.plugins[j].cycle = 0;
		fsnav->core.plugins[j].shift = 0;
		fsnav->core.plugins[j].tick  = 0;
		fsnav->core.plugin_count--;
		if (flag < 0xff)
			flag++;
	}

	// reallocate memory
	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), fsnav->core.plugin_count*sizeof(fsnav_plugin));
	if (fsnav->core.plugin_count > 0 && reallocated_pointer == NULL) { // memory reallocation somehow failed
		fsnav_free();
		return 0;
	}
	fsnav->core.plugins = reallocated_pointer;

	return flag;
}